

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

clock_rational_value_t
tchecker::delay(clockval_t *src,clock_constraint_container_t *invariant,
               clock_constraint_container_t *guard,clock_reset_container_t *reset,clockval_t *tgt)

{
  ulong *puVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  int *piVar5;
  long lVar6;
  clock_rational_value_t cVar7;
  void *pvVar8;
  bool bVar9;
  type_conflict2 tVar10;
  uint uVar11;
  rational<long> *prVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  clockval_t *pcVar18;
  no_storage_array_t<boost::rational<long>_> *pnVar19;
  int *piVar20;
  long lVar21;
  delay_constraint_t upper;
  rational<long> t;
  delay_constraint_t lower;
  delay_constraint_t local_178;
  delay_constraint_t local_158;
  rational<long> local_138;
  delay_constraint_t local_120;
  clockval_t *local_108;
  ulong local_100;
  undefined1 local_f8 [32];
  delay_constraint_t local_d8;
  delay_constraint_t local_c0;
  clockval_t *local_a8;
  no_storage_array_t<boost::rational<long>_> *local_a0;
  no_storage_array_t<boost::rational<long>_> *local_98;
  tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> local_90;
  tuple<tchecker::delay_constraint_t,_tchecker::delay_constraint_t> local_60;
  
  uVar2 = (src->super_clock_value_array_t).super_clockval_base_t.
          super_array_capacity_t<unsigned_short>._capacity;
  uVar3 = (tgt->super_clock_value_array_t).super_clockval_base_t.
          super_array_capacity_t<unsigned_short>._capacity;
  if (uVar2 != uVar3) {
    __assert_fail("src.size() == tgt.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                  ,0x327,
                  "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                 );
  }
  if (uVar2 != 0) {
    if ((*(long *)&src[1].super_clock_value_array_t != 1) ||
       ((src->super_clock_value_array_t)._fam != (no_storage_array_t<boost::rational<long>_>)0x0)) {
      __assert_fail("src[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                    ,0x328,
                    "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                   );
    }
    if (uVar3 != 0) {
      if ((*(long *)&tgt[1].super_clock_value_array_t != 1) ||
         ((tgt->super_clock_value_array_t)._fam != (no_storage_array_t<boost::rational<long>_>)0x0))
      {
        __assert_fail("tgt[0] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                      ,0x329,
                      "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                     );
      }
      bVar9 = satisfies(src,invariant);
      if (!bVar9) {
        __assert_fail("tchecker::satisfies(src, invariant)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                      ,0x32a,
                      "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                     );
      }
      delay_constraints(&local_60,src,guard);
      delay_constraints(&local_90,src,invariant);
      local_100 = (ulong)(src->super_clock_value_array_t).super_clockval_base_t.
                         super_array_capacity_t<unsigned_short>._capacity;
      local_178.bound.num = 0;
      local_178.bound.den = 1;
      local_178.strict = false;
      local_158.bound.num = 0x3fffffff;
      local_158.bound.den = 1;
      local_158.strict = false;
      local_108 = src;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,local_100
                 ,0,(allocator<unsigned_long> *)&local_d8);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
      piVar5 = *(int **)(reset + 8);
      local_a8 = tgt;
      if (*(int **)reset != piVar5) {
        local_98 = &(local_108->super_clock_value_array_t)._fam;
        pnVar19 = &(tgt->super_clock_value_array_t)._fam;
        piVar20 = *(int **)reset + 2;
        local_a0 = pnVar19;
        do {
          uVar11 = piVar20[-2];
          if (uVar11 != 0x7fffffff && (uint)local_100 <= uVar11) {
            __assert_fail("(r.left_id() < dim) || (r.left_id() == tchecker::REFCLOCK_ID)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                          ,0x2fc,
                          "std::tuple<tchecker::delay_constraint_t, tchecker::delay_constraint_t> tchecker::delay_constraints(const tchecker::clockval_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                         );
          }
          uVar13 = piVar20[-1];
          if (uVar13 != 0x7fffffff && (uint)local_100 <= uVar13) {
            __assert_fail("(r.right_id() < dim) || (r.right_id() == tchecker::REFCLOCK_ID)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                          ,0x2fd,
                          "std::tuple<tchecker::delay_constraint_t, tchecker::delay_constraint_t> tchecker::delay_constraints(const tchecker::clockval_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                         );
          }
          if (uVar11 == 0x7fffffff && uVar13 == 0x7fffffff) {
            __assert_fail("(r.left_id() != tchecker::REFCLOCK_ID) || (r.right_id() != tchecker::REFCLOCK_ID)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                          ,0x2fe,
                          "std::tuple<tchecker::delay_constraint_t, tchecker::delay_constraint_t> tchecker::delay_constraints(const tchecker::clockval_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                         );
          }
          if (uVar13 == 0x7fffffff) {
            if ((tgt->super_clock_value_array_t).super_clockval_base_t.
                super_array_capacity_t<unsigned_short>._capacity <= (ushort)(uVar11 + 1))
            goto LAB_0013938c;
            uVar16 = (ulong)((uVar11 + 1 & 0xffff) << 4);
            if ((*(long *)((long)(pnVar19 + 1) + uVar16) != 1) ||
               (*(long *)(&pnVar19->field_0x0 + uVar16) != (long)*piVar20)) {
LAB_0013900c:
              local_158.bound.num = local_178.bound.num - local_178.bound.den;
              local_158.bound.den = local_178.bound.den;
            }
          }
          else {
            uVar13 = uVar13 + 1;
            uVar11 = uVar11 + 1;
            uVar4 = (tgt->super_clock_value_array_t).super_clockval_base_t.
                    super_array_capacity_t<unsigned_short>._capacity;
            if ((*(ulong *)(CONCAT44(local_f8._4_4_,local_f8._0_4_) + (ulong)(uVar13 >> 6) * 8) >>
                 ((ulong)uVar13 & 0x3f) & 1) == 0) {
              if ((uVar4 <= (ushort)uVar11) || (uVar4 <= (ushort)uVar13)) goto LAB_0013938c;
              uVar16 = (ulong)((uVar11 & 0xffff) << 4);
              uVar14 = (ulong)((uVar13 & 0xffff) << 4);
              lVar21 = *(long *)((long)(pnVar19 + 1) + uVar14);
              if ((*(long *)(&pnVar19->field_0x0 + uVar16) !=
                   *piVar20 * lVar21 + *(long *)(&pnVar19->field_0x0 + uVar14)) ||
                 (*(long *)((long)(pnVar19 + 1) + uVar16) != lVar21)) goto LAB_0013900c;
            }
            else {
              if ((uVar4 <= (ushort)uVar11) ||
                 ((local_108->super_clock_value_array_t).super_clockval_base_t.
                  super_array_capacity_t<unsigned_short>._capacity <= (ushort)uVar13))
              goto LAB_0013938c;
              local_d8.bound.num = *(long *)(&pnVar19->field_0x0 + ((uVar11 & 0xffff) << 4));
              local_d8.bound.den =
                   *(ulong *)((long)(&pnVar19->field_0x0 + ((uVar11 & 0xffff) << 4)) + 8);
              prVar12 = boost::rational<long>::operator-=
                                  (&local_d8.bound,
                                   (rational<long> *)
                                   (&local_98->field_0x0 + ((uVar13 & 0xffff) << 4)));
              lVar21 = prVar12->den;
              lVar15 = prVar12->num - *piVar20 * lVar21;
              local_120.strict = false;
              local_120.bound.num = lVar15;
              local_120.bound.den = lVar21;
              max(&local_d8,&local_178,&local_120);
              local_178.strict = local_d8.strict;
              local_178.bound.num = local_d8.bound.num;
              local_178.bound.den = local_d8.bound.den;
              local_120.strict = false;
              local_120.bound.num = lVar15;
              local_120.bound.den = lVar21;
              min(&local_d8,&local_158,&local_120);
              local_158.strict = local_d8.strict;
              local_158.bound.num = local_d8.bound.num;
              local_158.bound.den = local_d8.bound.den;
              pnVar19 = local_a0;
              tgt = local_a8;
            }
          }
          uVar16 = (ulong)(piVar20[-2] + 1);
          if (piVar20[-2] == 0x7fffffff) {
            uVar16 = 0;
          }
          uVar14 = *(ulong *)(CONCAT44(local_f8._4_4_,local_f8._0_4_) + (uVar16 >> 6) * 8);
          if ((uVar14 >> (uVar16 & 0x3f) & 1) == 0) {
            __assert_fail("non_reset_clocks[CV_ID(r.left_id())]",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                          ,0x311,
                          "std::tuple<tchecker::delay_constraint_t, tchecker::delay_constraint_t> tchecker::delay_constraints(const tchecker::clockval_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                         );
          }
          *(ulong *)(CONCAT44(local_f8._4_4_,local_f8._0_4_) + (uVar16 >> 6) * 8) =
               uVar14 & ~(1L << ((byte)uVar16 & 0x3f));
          piVar17 = piVar20 + 1;
          piVar20 = piVar20 + 3;
        } while (piVar17 != piVar5);
      }
      *(ulong *)CONCAT44(local_f8._4_4_,local_f8._0_4_) =
           *(ulong *)CONCAT44(local_f8._4_4_,local_f8._0_4_) & 0xfffffffffffffffe;
      if ((uint)local_100 != 0) {
        lVar21 = 8;
        uVar16 = 0;
        pcVar18 = local_108;
        do {
          if ((*(ulong *)(CONCAT44(local_f8._4_4_,local_f8._0_4_) + (uVar16 >> 6) * 8) >>
               (uVar16 & 0x3f) & 1) != 0) {
            if (((tgt->super_clock_value_array_t).super_clockval_base_t.
                 super_array_capacity_t<unsigned_short>._capacity <= (ushort)uVar16) ||
               ((pcVar18->super_clock_value_array_t).super_clockval_base_t.
                super_array_capacity_t<unsigned_short>._capacity <= (ushort)uVar16))
            goto LAB_0013938c;
            puVar1 = (ulong *)((long)&(tgt->super_clock_value_array_t).super_clockval_base_t.
                                      super_array_capacity_t<unsigned_short>._capacity + lVar21);
            local_d8.bound.num = *puVar1;
            local_d8.bound.den = puVar1[1];
            prVar12 = boost::rational<long>::operator-=
                                (&local_d8.bound,
                                 (rational<long> *)
                                 ((long)&(pcVar18->super_clock_value_array_t).super_clockval_base_t.
                                         super_array_capacity_t<unsigned_short>._capacity + lVar21))
            ;
            lVar15 = prVar12->num;
            lVar6 = prVar12->den;
            local_120.strict = false;
            local_120.bound.num = lVar15;
            local_120.bound.den = lVar6;
            max(&local_d8,&local_178,&local_120);
            tgt = local_a8;
            pcVar18 = local_108;
            local_178.strict = local_d8.strict;
            local_178.bound.num = local_d8.bound.num;
            local_178.bound.den = local_d8.bound.den;
            local_120.strict = false;
            local_120.bound.num = lVar15;
            local_120.bound.den = lVar6;
            min(&local_d8,&local_158,&local_120);
            local_158.strict = local_d8.strict;
            local_158.bound.num = local_d8.bound.num;
            local_158.bound.den = local_d8.bound.den;
          }
          uVar16 = uVar16 + 1;
          lVar21 = lVar21 + 0x10;
        } while (local_100 != uVar16);
      }
      local_d8._17_7_ = local_158._17_7_;
      local_d8.strict = local_158.strict;
      local_d8.bound.num = local_158.bound.num;
      local_d8.bound.den = local_158.bound.den;
      local_c0.bound.num = local_178.bound.num;
      local_c0.bound.den = local_178.bound.den;
      local_c0._17_7_ = local_178._17_7_;
      local_c0.strict = local_178.strict;
      bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_f8);
      if (!bVar9) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      pvVar8 = (void *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,CONCAT71(local_f8._17_7_,local_f8[0x10]) - (long)pvVar8);
      }
      max(&local_178,
          &local_60.
           super__Tuple_impl<0UL,_tchecker::delay_constraint_t,_tchecker::delay_constraint_t>.
           super__Head_base<0UL,_tchecker::delay_constraint_t,_false>._M_head_impl,
          &local_90.
           super__Tuple_impl<0UL,_tchecker::delay_constraint_t,_tchecker::delay_constraint_t>.
           super__Head_base<0UL,_tchecker::delay_constraint_t,_false>._M_head_impl);
      max((delay_constraint_t *)local_f8,&local_178,&local_c0);
      min(&local_158,(delay_constraint_t *)&local_60,(delay_constraint_t *)&local_90);
      min(&local_178,&local_158,&local_d8);
      bVar9 = boost::rational<long>::operator<(&local_178.bound,(rational<long> *)local_f8);
      if ((bVar9) ||
         (((local_178.bound.num == CONCAT44(local_f8._4_4_,local_f8._0_4_) &&
           (local_178.bound.den == CONCAT44(local_f8._12_4_,local_f8._8_4_))) &&
          ((local_f8[0x10] != false || (local_178.strict == true)))))) {
        local_138.num._0_4_ = 0xffffffff;
        local_138.num._4_4_ = 0xffffffff;
        local_138.den._0_4_ = 1;
        local_138.den._4_4_ = 0;
      }
      else {
        local_138.num._0_4_ = 0;
        local_138.num._4_4_ = 0;
        local_138.den._0_4_ = 1;
        local_138.den._4_4_ = 0;
        if (local_f8[0x10] != false) {
          if (local_178.bound.num == 0x3fffffff && local_178.bound.den == 1) {
            local_120.bound.num = 5;
            local_120.bound.den = 10;
            boost::rational<long>::normalize(&local_120.bound);
            local_158.bound.num = (ulong)(uint)local_f8._4_4_ << 0x20;
            local_158.bound.den = CONCAT44(local_f8._12_4_,local_f8._8_4_);
            prVar12 = boost::rational<long>::operator+=(&local_158.bound,&local_120.bound);
          }
          else {
            local_158.bound.num = local_178.bound.num;
            local_158.bound.den = local_178.bound.den;
            prVar12 = boost::rational<long>::operator+=(&local_158.bound,(rational<long> *)local_f8)
            ;
            local_158.bound.num = prVar12->num;
            local_158.bound.den = prVar12->den;
            local_120.bound.num = CONCAT44(local_120.bound.num._4_4_,2);
            prVar12 = boost::rational<long>::operator/=(&local_158.bound,(int *)&local_120);
          }
          local_f8._0_4_ = (undefined4)prVar12->num;
          local_f8._4_4_ = *(uint *)((long)&prVar12->num + 4);
          local_f8._8_4_ = (undefined4)prVar12->den;
          local_f8._12_4_ = *(undefined4 *)((long)&prVar12->den + 4);
        }
        local_158.bound.num = local_158.bound.num & 0xffffffff00000000;
        local_138.num._0_4_ = local_f8._0_4_;
        local_138.num._4_4_ = local_f8._4_4_;
        local_138.den._0_4_ = local_f8._8_4_;
        local_138.den._4_4_ = local_f8._12_4_;
        tVar10 = boost::rational<long>::operator<(&local_138,(int *)&local_158);
        if (tVar10) {
          __assert_fail("delay >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc"
                        ,0x341,
                        "tchecker::clock_rational_value_t tchecker::delay(const tchecker::clockval_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_constraint_container_t &, const tchecker::clock_reset_container_t &, const tchecker::clockval_t &)"
                       );
        }
      }
      cVar7.num._4_4_ = local_138.num._4_4_;
      cVar7.num._0_4_ = (undefined4)local_138.num;
      cVar7.den._0_4_ = (undefined4)local_138.den;
      cVar7.den._4_4_ = local_138.den._4_4_;
      return cVar7;
    }
  }
LAB_0013938c:
  __assert_fail("i < BASE::_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                ,0xfd,
                "const T &tchecker::make_array_t<boost::rational<long>, 16, tchecker::clockval_base_t>::operator[](typename BASE::capacity_t) const [T = boost::rational<long>, T_ALLOCSIZE = 16, BASE = tchecker::clockval_base_t]"
               );
}

Assistant:

tchecker::clock_rational_value_t delay(tchecker::clockval_t const & src,
                                       tchecker::clock_constraint_container_t const & invariant,
                                       tchecker::clock_constraint_container_t const & guard,
                                       tchecker::clock_reset_container_t const & reset, tchecker::clockval_t const & tgt)
{
  assert(src.size() == tgt.size());
  assert(src[0] == 0);
  assert(tgt[0] == 0);
  assert(tchecker::satisfies(src, invariant));

  // get lower and upeer constraints on delays from guard, invariant and reset, then choose some delay in-between
  auto && [lower_guard, upper_guard] = tchecker::delay_constraints(src, guard);
  auto && [lower_invariant, upper_invariant] = tchecker::delay_constraints(src, invariant);
  auto && [lower_reset, upper_reset] = tchecker::delay_constraints(src, reset, tgt);

  tchecker::delay_constraint_t const lower = tchecker::max(tchecker::max(lower_guard, lower_invariant), lower_reset);
  tchecker::delay_constraint_t const upper = tchecker::min(tchecker::min(upper_guard, upper_invariant), upper_reset);

  if (upper.bound < lower.bound)
    return -1;
  if ((upper.bound == lower.bound) && (lower.strict || upper.strict))
    return -1;

  tchecker::clock_rational_value_t delay = 0;
  if (!lower.strict)
    delay = lower.bound;
  else if (upper.bound == tchecker::dbm::INF_VALUE)
    delay = lower.bound + tchecker::clock_rational_value_t{5, 10};
  else
    delay = (upper.bound + lower.bound) / 2;

  assert(delay >= 0);

  return delay;
}